

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O1

void __thiscall btLCP::solve1(btLCP *this,btScalar *a,int i,int dir,int only_transfer)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  btScalar *pbVar4;
  int *piVar5;
  btScalar *pbVar6;
  btScalar *pbVar7;
  int *C;
  long lVar8;
  ulong uVar9;
  long lVar10;
  
  iVar1 = this->m_nC;
  if (0 < (long)iVar1) {
    pbVar4 = this->m_Dell;
    piVar5 = this->m_C;
    pbVar6 = this->m_A[i];
    iVar2 = this->m_nub;
    uVar9 = 0;
    if (0 < (long)iVar2) {
      do {
        pbVar4[uVar9] = pbVar6[uVar9];
        uVar9 = uVar9 + 1;
      } while ((long)iVar2 != uVar9);
    }
    if ((int)uVar9 < iVar1) {
      uVar9 = uVar9 & 0xffffffff;
      do {
        pbVar4[uVar9] = pbVar6[piVar5[uVar9]];
        uVar9 = uVar9 + 1;
      } while ((long)iVar1 != uVar9);
    }
    btSolveL1(this->m_L,pbVar4,iVar1,this->m_nskip);
    pbVar4 = this->m_ell;
    iVar1 = this->m_nC;
    lVar8 = (long)iVar1;
    if (0 < lVar8) {
      pbVar6 = this->m_d;
      pbVar7 = this->m_Dell;
      lVar10 = 0;
      do {
        pbVar4[lVar10] = pbVar7[lVar10] * pbVar6[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar8 != lVar10);
    }
    if (only_transfer == 0) {
      pbVar6 = this->m_tmp;
      if (0 < iVar1) {
        lVar10 = 0;
        do {
          pbVar6[lVar10] = pbVar4[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar8 != lVar10);
      }
      btSolveL1T(this->m_L,pbVar6,iVar1,this->m_nskip);
      piVar5 = this->m_C;
      pbVar4 = this->m_tmp;
      uVar3 = this->m_nC;
      if (dir < 1) {
        if (0 < (int)uVar3) {
          uVar9 = 0;
          do {
            a[piVar5[uVar9]] = pbVar4[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar3 != uVar9);
        }
      }
      else if (0 < (int)uVar3) {
        uVar9 = 0;
        do {
          a[piVar5[uVar9]] = -pbVar4[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar3 != uVar9);
      }
    }
  }
  return;
}

Assistant:

void btLCP::solve1 (btScalar *a, int i, int dir, int only_transfer)
{
  // the `Dell' and `ell' that are computed here are saved. if index i is
  // later added to the factorization then they can be reused.
  //
  // @@@ question: do we need to solve for entire delta_x??? yes, but
  //     only if an x goes below 0 during the step.

  if (m_nC > 0) {
    {
      btScalar *Dell = m_Dell;
      int *C = m_C;
      btScalar *aptr = BTAROW(i);
#   ifdef BTNUB_OPTIMIZATIONS
      // if nub>0, initial part of aptr[] is guaranteed unpermuted
      const int nub = m_nub;
      int j=0;
      for ( ; j<nub; ++j) Dell[j] = aptr[j];
      const int nC = m_nC;
      for ( ; j<nC; ++j) Dell[j] = aptr[C[j]];
#   else
      const int nC = m_nC;
      for (int j=0; j<nC; ++j) Dell[j] = aptr[C[j]];
#   endif
    }
    btSolveL1 (m_L,m_Dell,m_nC,m_nskip);
    {
      btScalar *ell = m_ell, *Dell = m_Dell, *d = m_d;
      const int nC = m_nC;
      for (int j=0; j<nC; ++j) ell[j] = Dell[j] * d[j];
    }

    if (!only_transfer) {
      btScalar *tmp = m_tmp, *ell = m_ell;
      {
        const int nC = m_nC;
        for (int j=0; j<nC; ++j) tmp[j] = ell[j];
      }
      btSolveL1T (m_L,tmp,m_nC,m_nskip);
      if (dir > 0) {
        int *C = m_C;
        btScalar *tmp = m_tmp;
        const int nC = m_nC;
        for (int j=0; j<nC; ++j) a[C[j]] = -tmp[j];
      } else {
        int *C = m_C;
        btScalar *tmp = m_tmp;
        const int nC = m_nC;
        for (int j=0; j<nC; ++j) a[C[j]] = tmp[j];
      }
    }
  }
}